

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O1

float __thiscall LumaQuantizer::quantize(LumaQuantizer *this,float val,uint ch)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  uint in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint in_XMM3_Dc;
  uint in_XMM3_Dd;
  
  if ((ch == 0) || ((this->m_colorSpace | CS_YCBCR) == CS_XYZ)) {
    uVar2 = this->m_maxVal;
    uVar4 = 0;
    if (1 < (int)uVar2) {
      uVar4 = 0;
      do {
        uVar3 = uVar4 + uVar2 >> 1;
        if (val < this->m_mapping[uVar3]) {
          uVar2 = uVar3;
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
      } while ((int)(uVar4 + 1) < (int)uVar2);
    }
    uVar3 = -(uint)(val - this->m_mapping[uVar4] < this->m_mapping[(int)uVar2] - val);
    auVar6._0_4_ = ~uVar3 & (uint)(float)(int)uVar2;
    auVar6._4_4_ = 0;
    auVar6._8_4_ = ~in_XMM0_Dc & in_XMM3_Dc;
    auVar6._12_4_ = ~in_XMM0_Dd & in_XMM3_Dd;
    auVar7 = auVar6 | ZEXT416((uint)(float)uVar4 & uVar3);
  }
  else {
    auVar8._0_4_ = (float)this->m_maxValColor;
    fVar5 = floorf(val * auVar8._0_4_ + 0.5);
    auVar7._4_4_ = extraout_XMM0_Db;
    auVar7._0_4_ = fVar5;
    auVar7._8_4_ = extraout_XMM0_Dc;
    auVar7._12_4_ = extraout_XMM0_Dd;
    if (auVar8._0_4_ <= fVar5) {
      auVar8._4_12_ = auVar7._4_12_;
      auVar7 = auVar8;
    }
    if (auVar7._0_4_ <= 0.0) {
      auVar1._12_4_ = 0;
      auVar1._0_12_ = auVar7._4_12_;
      auVar7 = auVar1 << 0x20;
    }
  }
  return auVar7._0_4_;
}

Assistant:

float LumaQuantizer::quantize(const float val, const unsigned int ch) const
{
    float res;
    
	if (ch == 0 || m_colorSpace == CS_RGB || m_colorSpace == CS_XYZ)
    {
	    //binary search for best fitting luminance
	    int l = 0, r = m_maxVal;
	    while( l+1 < r )
	    {
		    int m = (l+r)/2;
		    if( val < m_mapping[m] )
			    r = m;
		    else
			    l = m;
	    }
	    //assert( r - l == 1 );
	    if ( val - m_mapping[l] < m_mapping[r] - val )
		    res = (float)l;
	    else
		    res = (float)r;
	}
	else
	{
	    res = floor(m_maxValColor*val + 0.5f);
        res = std::max(0.0f, std::min((float)m_maxValColor, res));
    }
	
	return res;
}